

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

bool __thiscall ctemplate::TemplateCache::Delete(TemplateCache *this,TemplateString *key)

{
  Mutex *this_00;
  _Hash_node_base *p_Var1;
  __node_base *p_Var2;
  pointer ppVar3;
  bool bVar4;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> to_erase;
  _Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  local_48;
  
  this_00 = this->mutex_;
  Mutex::Lock(this_00);
  if (this->is_frozen_ == false) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var1 = (_Hash_node_base *)TemplateString::GetGlobalId(key);
    p_Var2 = &(this->parsed_template_cache_->_M_h)._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, ppVar3 = local_48._M_impl.super__Vector_impl_data._M_start,
          p_Var2 != (__node_base *)0x0) {
      if (p_Var2[1]._M_nxt == p_Var1) {
        RefcountedTemplate::DecRef((RefcountedTemplate *)p_Var2[3]._M_nxt);
        std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
        ::push_back((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                     *)&local_48,(value_type *)(p_Var2 + 1));
      }
    }
    for (; ppVar3 != local_48._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
      std::
      _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&this->parsed_template_cache_->_M_h,ppVar3);
    }
    bVar4 = ppVar3 != local_48._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
    ~_Vector_base(&local_48);
  }
  else {
    bVar4 = false;
  }
  Mutex::Unlock(this_00);
  return bVar4;
}

Assistant:

bool TemplateCache::Delete(const TemplateString& key) {
  WriterMutexLock ml(mutex_);
  if (is_frozen_) {  // Cannot delete from a frozen cache.
    return false;
  }
  vector<TemplateCacheKey> to_erase;
  const TemplateId key_id = key.GetGlobalId();
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end();  ++it) {
    if (it->first.first == key_id) {
      // We'll delete the content pointed to by the entry here, since
      // it's handy, but we won't delete the entry itself quite yet.
      it->second.refcounted_tpl->DecRef();
      to_erase.push_back(it->first);
    }
  }
  for (vector<TemplateCacheKey>::iterator it = to_erase.begin();
       it != to_erase.end(); ++it) {
    parsed_template_cache_->erase(*it);
  }
  return !to_erase.empty();
}